

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ReplicatedAssignmentPatternSyntax *pRVar1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *unaff_retaddr;
  Token *in_stack_00000008;
  ExpressionSyntax *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  Token *in_stack_00000030;
  BumpAllocator *in_stack_000000d8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  ExpressionSyntax *in_stack_ffffffffffffff90;
  
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7bdf33);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::ReplicatedAssignmentPatternSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn,in_stack_00000030);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const ReplicatedAssignmentPatternSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ReplicatedAssignmentPatternSyntax>(
        node.openBrace.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.countExpr, alloc),
        node.innerOpenBrace.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.innerCloseBrace.deepClone(alloc),
        node.closeBrace.deepClone(alloc)
    );
}